

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squserdata.h
# Opt level: O1

void __thiscall SQUserData::~SQUserData(SQUserData *this)

{
  ~SQUserData(this);
  operator_delete(this);
  return;
}

Assistant:

~SQUserData()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain, this);
        SetDelegate(NULL);
    }